

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int read_skip_mode(AV1_COMMON *cm,MACROBLOCKD *xd,int segment_id,aom_reader *r)

{
  int iVar1;
  uint8_t in_DL;
  MACROBLOCKD *in_RSI;
  long in_RDI;
  int skip_mode;
  FRAME_CONTEXT *ec_ctx;
  int ctx;
  aom_cdf_prob *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  if ((((*(int *)(in_RDI + 0x18) != 0) &&
       (iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),in_DL,'\x06'), iVar1 == 0)) &&
      (iVar1 = is_comp_ref_allowed((*in_RSI->mi)->bsize), iVar1 != 0)) &&
     ((iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),in_DL,'\x05'), iVar1 == 0 &&
      (iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),in_DL,'\a'), iVar1 == 0)))) {
    av1_get_skip_mode_context(in_RSI);
    iVar1 = aom_read_symbol_((aom_reader *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             in_stack_ffffffffffffffb8,0);
    return iVar1;
  }
  return 0;
}

Assistant:

static int read_skip_mode(AV1_COMMON *cm, const MACROBLOCKD *xd, int segment_id,
                          aom_reader *r) {
  if (!cm->current_frame.skip_mode_info.skip_mode_flag) return 0;

  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP)) {
    return 0;
  }

  if (!is_comp_ref_allowed(xd->mi[0]->bsize)) return 0;

  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME) ||
      segfeature_active(&cm->seg, segment_id, SEG_LVL_GLOBALMV)) {
    // These features imply single-reference mode, while skip mode implies
    // compound reference. Hence, the two are mutually exclusive.
    // In other words, skip_mode is implicitly 0 here.
    return 0;
  }

  const int ctx = av1_get_skip_mode_context(xd);
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  const int skip_mode =
      aom_read_symbol(r, ec_ctx->skip_mode_cdfs[ctx], 2, ACCT_STR);
  return skip_mode;
}